

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O1

int lj_cf_collectgarbage(lua_State *L)

{
  int what;
  int iVar1;
  
  what = lj_lib_checkopt(L,1,2,anon_var_dwarf_1e51);
  iVar1 = 0;
  if ((L->base + 1 < L->top) && (iVar1 = 0, *(int *)((long)L->base + 0xc) != -1)) {
    iVar1 = lj_lib_checkint(L,2);
  }
  if (what == 3) {
    L->top->n = (double)*(uint *)((ulong)(L->glref).ptr32 + 0x20) * 0.0009765625;
  }
  else {
    iVar1 = lua_gc(L,what,iVar1);
    if (what == 5) {
      (L->top->field_2).it = -iVar1 - 2;
    }
    else {
      L->top->n = (double)iVar1;
    }
  }
  L->top = L->top + 1;
  return 1;
}

Assistant:

LJLIB_CF(collectgarbage)
{
  int opt = lj_lib_checkopt(L, 1, LUA_GCCOLLECT,  /* ORDER LUA_GC* */
    "\4stop\7restart\7collect\5count\1\377\4step\10setpause\12setstepmul");
  int32_t data = lj_lib_optint(L, 2, 0);
  if (opt == LUA_GCCOUNT) {
    setnumV(L->top, (lua_Number)G(L)->gc.total/1024.0);
  } else {
    int res = lua_gc(L, opt, data);
    if (opt == LUA_GCSTEP)
      setboolV(L->top, res);
    else
      setintV(L->top, res);
  }
  L->top++;
  return 1;
}